

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  string *psVar1;
  pointer pcVar2;
  size_type sVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  __type _Var7;
  string *psVar8;
  string *psVar9;
  string *psVar10;
  bool bVar11;
  string *local_180;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') {
    matching_name_abi_cxx11_();
  }
  bVar4 = (other->super_OptionBase<CLI::Option>).configurable_ &
          (this->super_OptionBase<CLI::Option>).configurable_;
  psVar10 = (this->snames_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar11 = psVar10 == psVar1;
  if (!bVar11) {
    do {
      pcVar2 = (psVar10->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + psVar10->_M_string_length);
      bVar5 = check_sname(other,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        bVar6 = 0;
        local_180 = psVar10;
      }
      else {
        if (bVar4 == 0) {
          bVar5 = false;
        }
        else {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          pcVar2 = (psVar10->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,pcVar2,pcVar2 + psVar10->_M_string_length);
          bVar5 = check_lname(other,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        bVar6 = bVar5 ^ 1;
        if (bVar5 != false) {
          local_180 = psVar10;
        }
      }
      if (bVar6 == 0) break;
      psVar10 = psVar10 + 1;
      bVar11 = psVar10 == psVar1;
    } while (!bVar11);
  }
  if (bVar11) {
    psVar10 = (this->lnames_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = psVar10 == psVar1;
    if (!bVar11) {
      do {
        pcVar2 = (psVar10->_M_dataplus)._M_p;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + psVar10->_M_string_length);
        bVar5 = check_lname(other,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (bVar5) {
          bVar5 = false;
          local_180 = psVar10;
        }
        else {
          if ((psVar10->_M_string_length == 1 & bVar4) == 1) {
            pcVar2 = (psVar10->_M_dataplus)._M_p;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar2,pcVar2 + psVar10->_M_string_length);
            bVar5 = check_sname(other,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) {
              bVar5 = false;
              local_180 = psVar10;
              goto LAB_001a6c4e;
            }
          }
          bVar5 = true;
        }
LAB_001a6c4e:
        if (!bVar5) break;
        psVar10 = psVar10 + 1;
        bVar11 = psVar10 == psVar1;
      } while (!bVar11);
    }
    if (bVar11) {
      if (bVar4 != 0) {
        if ((((this->snames_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->snames_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            ((this->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           (sVar3 = (this->pname_)._M_string_length, sVar3 != 0)) {
          psVar10 = &this->pname_;
          pcVar2 = (psVar10->_M_dataplus)._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar2,pcVar2 + sVar3);
          bVar11 = check_sname(other,&local_90);
          _Var7 = true;
          if (!bVar11) {
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            pcVar2 = (this->pname_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar2,pcVar2 + (this->pname_)._M_string_length);
            bVar5 = check_lname(other,&local_130);
            if (!bVar5) {
              _Var7 = ::std::operator==(psVar10,&other->pname_);
            }
          }
          if ((!bVar11) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2)) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (_Var7 != false) {
            return psVar10;
          }
        }
        if ((((other->snames_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (other->snames_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            ((other->fnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (other->fnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           (sVar3 = (other->pname_)._M_string_length, sVar3 != 0)) {
          psVar10 = &other->pname_;
          pcVar2 = (psVar10->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar2,pcVar2 + sVar3);
          bVar11 = check_sname(this,&local_b0);
          _Var7 = true;
          if (!bVar11) {
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            pcVar2 = (other->pname_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,pcVar2,pcVar2 + (other->pname_)._M_string_length);
            bVar5 = check_lname(this,&local_150);
            if (!bVar5) {
              _Var7 = ::std::operator==(&this->pname_,psVar10);
            }
          }
          if ((!bVar11) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2)) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (_Var7 != false) {
            return psVar10;
          }
        }
      }
      if (((this->super_OptionBase<CLI::Option>).ignore_case_ != false) ||
         ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true)) {
        psVar10 = (other->snames_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (other->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar11 = psVar10 == psVar1;
        psVar8 = local_180;
        if (!bVar11) {
          do {
            pcVar2 = (psVar10->_M_dataplus)._M_p;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,pcVar2,pcVar2 + psVar10->_M_string_length);
            bVar5 = check_sname(this,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            psVar8 = psVar10;
            if (bVar5) break;
            psVar10 = psVar10 + 1;
            bVar11 = psVar10 == psVar1;
            psVar8 = local_180;
          } while (!bVar11);
        }
        if (!bVar11) {
          return psVar8;
        }
        psVar10 = (other->lnames_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar1 = (other->lnames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar11 = psVar10 == psVar1;
        psVar9 = psVar8;
        if (!bVar11) {
          do {
            psVar9 = psVar10;
            pcVar2 = (psVar9->_M_dataplus)._M_p;
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar2,pcVar2 + psVar9->_M_string_length);
            bVar5 = check_lname(this,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if (bVar5) break;
            psVar10 = psVar9 + 1;
            bVar11 = psVar10 == psVar1;
            psVar9 = psVar8;
          } while (!bVar11);
        }
        if (!bVar11) {
          return psVar9;
        }
      }
      local_180 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
    }
  }
  return local_180;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &Option::matching_name(const Option &other) const {
    static const std::string estring;
    bool bothConfigurable = configurable_ && other.configurable_;
    for(const std::string &sname : snames_) {
        if(other.check_sname(sname))
            return sname;
        if(bothConfigurable && other.check_lname(sname))
            return sname;
    }
    for(const std::string &lname : lnames_) {
        if(other.check_lname(lname))
            return lname;
        if(lname.size() == 1 && bothConfigurable) {
            if(other.check_sname(lname)) {
                return lname;
            }
        }
    }
    if(bothConfigurable && snames_.empty() && lnames_.empty() && !pname_.empty()) {
        if(other.check_sname(pname_) || other.check_lname(pname_) || pname_ == other.pname_)
            return pname_;
    }
    if(bothConfigurable && other.snames_.empty() && other.fnames_.empty() && !other.pname_.empty()) {
        if(check_sname(other.pname_) || check_lname(other.pname_) || (pname_ == other.pname_))
            return other.pname_;
    }
    if(ignore_case_ ||
       ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return sname;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return lname;
    }
    return estring;
}